

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void process(lzma_check_state *check)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint local_108;
  uint local_104;
  uint local_f8;
  uint local_f4;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  
  uVar1 = (check->state).crc32;
  uVar2 = (check->state).sha256.state[1];
  uVar3 = (check->state).sha256.state[2];
  uVar4 = (check->state).sha256.state[3];
  uVar5 = (check->state).sha256.state[4];
  uVar6 = (check->state).sha256.state[5];
  uVar7 = (check->state).sha256.state[6];
  uVar8 = (check->state).sha256.state[7];
  uVar9 = (uVar5 << 0x12 | uVar5 >> 0xe) ^ uVar5;
  uVar10 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar5;
  uVar9 = (check->buffer).u32[0];
  uVar18 = (check->buffer).u32[1];
  uVar20 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar14 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 + (uVar10 << 0x1a | uVar10 >> 6);
  uVar17 = uVar4 + iVar14 + uVar20 + 0x428a2f98;
  uVar9 = (uVar1 << 0x17 | uVar1 >> 9) ^ uVar1;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar1;
  uVar11 = (uVar3 & uVar2) + ((uVar3 ^ uVar2) & uVar1) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar20 + iVar14 + 0x428a2f98;
  uVar9 = (uVar17 * 0x40000 | uVar17 >> 0xe) ^ uVar17;
  uVar27 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  iVar14 = ((uVar6 ^ uVar5) & uVar17 ^ uVar6) + uVar7 + uVar27;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar17;
  uVar9 = uVar9 << 0x1a | uVar9 >> 6;
  uVar18 = (uVar11 * 0x800000 | uVar11 >> 9) ^ uVar11;
  uVar24 = uVar3 + iVar14 + uVar9 + 0x71374491;
  uVar18 = (uVar18 << 0x15 | uVar18 >> 0xb) ^ uVar11;
  uVar10 = (uVar24 * 0x40000 | uVar24 >> 0xe) ^ uVar24;
  uVar10 = (uVar10 << 0x1b | uVar10 >> 5) ^ uVar24;
  uVar21 = uVar10 << 0x1a | uVar10 >> 6;
  uVar15 = (uVar2 & uVar1) + ((uVar2 ^ uVar1) & uVar11) + (uVar18 << 0x1e | uVar18 >> 2) +
           uVar9 + iVar14 + 0x71374491;
  uVar9 = (check->buffer).u32[2];
  uVar10 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar14 = ((uVar17 ^ uVar5) & uVar24 ^ uVar5) + uVar10 + uVar6;
  uVar9 = (uVar15 * 0x800000 | uVar15 >> 9) ^ uVar15;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar15;
  uVar12 = (uVar11 & uVar1) + ((uVar11 ^ uVar1) & uVar15) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar21 + iVar14 + -0x4a3f0431;
  uVar28 = uVar2 + iVar14 + uVar21 + 0xb5c0fbcf;
  uVar9 = (check->buffer).u32[3];
  uVar18 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  iVar14 = ((uVar24 ^ uVar17) & uVar28 ^ uVar17) + uVar18 + uVar5;
  uVar9 = (uVar28 * 0x40000 | uVar28 >> 0xe) ^ uVar28;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar28;
  uVar21 = uVar9 << 0x1a | uVar9 >> 6;
  uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
  uVar31 = iVar14 + uVar21 + uVar1 + 0xe9b5dba5;
  uVar19 = (uVar15 & uVar11) + ((uVar15 ^ uVar11) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) +
           uVar21 + iVar14 + -0x164a245b;
  uVar9 = (check->buffer).u32[4];
  local_d8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar31;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar31;
  iVar14 = uVar17 + local_d8 + ((uVar28 ^ uVar24) & uVar31 ^ uVar24) + (uVar9 << 0x1a | uVar9 >> 6)
           + 0x3956c25b;
  uVar9 = (uVar19 * 0x800000 | uVar19 >> 9) ^ uVar19;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar19;
  uVar11 = uVar11 + iVar14;
  uVar22 = (uVar12 & uVar15) + ((uVar12 ^ uVar15) & uVar19) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[5];
  local_dc = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar11 * 0x40000 | uVar11 >> 0xe) ^ uVar11;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar11;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar24 + local_dc + ((uVar31 ^ uVar28) & uVar11 ^ uVar28)
           + 0x59f111f1;
  uVar9 = (uVar22 * 0x800000 | uVar22 >> 9) ^ uVar22;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar22;
  uVar15 = uVar15 + iVar14;
  uVar24 = (uVar19 & uVar12) + ((uVar19 ^ uVar12) & uVar22) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[6];
  local_e0 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar15 * 0x40000 | uVar15 >> 0xe) ^ uVar15;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar15;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar28 + local_e0 + ((uVar11 ^ uVar31) & uVar15 ^ uVar31)
           + -0x6dc07d5c;
  uVar9 = (uVar24 * 0x800000 | uVar24 >> 9) ^ uVar24;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar24;
  uVar12 = uVar12 + iVar14;
  uVar28 = (uVar22 & uVar19) + ((uVar22 ^ uVar19) & uVar24) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[7];
  local_c4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar12 * 0x40000 | uVar12 >> 0xe) ^ uVar12;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar12;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar31 + local_c4 + ((uVar15 ^ uVar11) & uVar12 ^ uVar11)
           + -0x54e3a12b;
  uVar9 = (uVar28 * 0x800000 | uVar28 >> 9) ^ uVar28;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar28;
  uVar19 = uVar19 + iVar14;
  uVar34 = (uVar24 & uVar22) + ((uVar24 ^ uVar22) & uVar28) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[8];
  local_f8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar19 * 0x40000 | uVar19 >> 0xe) ^ uVar19;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar19;
  iVar14 = uVar11 + local_f8 + ((uVar12 ^ uVar15) & uVar19 ^ uVar15) + (uVar9 << 0x1a | uVar9 >> 6)
           + -0x27f85568;
  uVar9 = (uVar34 * 0x800000 | uVar34 >> 9) ^ uVar34;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar34;
  uVar22 = uVar22 + iVar14;
  uVar21 = (uVar28 & uVar24) + ((uVar28 ^ uVar24) & uVar34) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[9];
  uVar17 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar22;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar22;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar15 + uVar17 + ((uVar19 ^ uVar12) & uVar22 ^ uVar12) +
           0x12835b01;
  uVar9 = (uVar21 * 0x800000 | uVar21 >> 9) ^ uVar21;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar21;
  uVar24 = uVar24 + iVar14;
  uVar32 = (uVar34 & uVar28) + ((uVar34 ^ uVar28) & uVar21) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[10];
  local_104 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar24 * 0x40000 | uVar24 >> 0xe) ^ uVar24;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar24;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar12 + local_104 + ((uVar22 ^ uVar19) & uVar24 ^ uVar19)
           + 0x243185be;
  uVar9 = (uVar32 * 0x800000 | uVar32 >> 9) ^ uVar32;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar32;
  uVar28 = uVar28 + iVar14;
  uVar31 = (uVar21 & uVar34) + ((uVar21 ^ uVar34) & uVar32) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[0xb];
  local_cc = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar28 * 0x40000 | uVar28 >> 0xe) ^ uVar28;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar28;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar19 + local_cc + ((uVar24 ^ uVar22) & uVar28 ^ uVar22)
           + 0x550c7dc3;
  uVar9 = (uVar31 * 0x800000 | uVar31 >> 9) ^ uVar31;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar31;
  uVar34 = uVar34 + iVar14;
  uVar12 = (uVar32 & uVar21) + ((uVar32 ^ uVar21) & uVar31) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[0xc];
  local_c8 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar34;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar34;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar22 + local_c8 + ((uVar28 ^ uVar24) & uVar34 ^ uVar24)
           + 0x72be5d74;
  uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
  uVar21 = uVar21 + iVar14;
  uVar19 = (uVar31 & uVar32) + ((uVar31 ^ uVar32) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[0xd];
  local_e4 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar21;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar21;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar24 + local_e4 + ((uVar34 ^ uVar28) & uVar21 ^ uVar28)
           + -0x7f214e02;
  uVar9 = (uVar19 * 0x800000 | uVar19 >> 9) ^ uVar19;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar19;
  uVar32 = uVar32 + iVar14;
  uVar15 = (uVar12 & uVar31) + ((uVar12 ^ uVar31) & uVar19) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14;
  uVar9 = (check->buffer).u32[0xe];
  uVar11 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar32;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar32;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar28 + uVar11 + ((uVar21 ^ uVar34) & uVar32 ^ uVar34) +
           -0x6423f959;
  uVar9 = (uVar15 * 0x800000 | uVar15 >> 9) ^ uVar15;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar15;
  uVar31 = uVar31 + iVar14;
  local_f4 = (uVar19 & uVar12) + ((uVar19 ^ uVar12) & uVar15) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
  uVar9 = (check->buffer).u32[0xf];
  local_108 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  uVar9 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar31;
  uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar31;
  iVar14 = (uVar9 << 0x1a | uVar9 >> 6) + uVar34 + local_108 + ((uVar32 ^ uVar21) & uVar31 ^ uVar21)
           + -0x3e640e8c;
  uVar9 = (local_f4 * 0x800000 | local_f4 >> 9) ^ local_f4;
  uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_f4;
  uVar12 = uVar12 + iVar14;
  uVar9 = (uVar15 & uVar19) + ((uVar15 ^ uVar19) & local_f4) + (uVar9 << 0x1e | uVar9 >> 2) + iVar14
  ;
  uVar13 = 0;
  do {
    uVar22 = (uVar12 << 0x12 | uVar12 >> 0xe) ^ uVar12;
    uVar22 = (uVar22 << 0x1b | uVar22 >> 5) ^ uVar12;
    uVar24 = (uVar11 << 0x1e | uVar11 >> 2) ^ uVar11;
    uVar28 = (uVar27 << 0x15 | uVar27 >> 0xb) ^ uVar27;
    uVar20 = uVar20 + uVar17 + (uVar27 >> 3 ^ (uVar28 << 0x19 | uVar28 >> 7)) +
             (uVar11 >> 10 ^ (uVar24 << 0xf | uVar24 >> 0x11));
    uVar24 = (uVar9 << 0x17 | uVar9 >> 9) ^ uVar9;
    uVar24 = (uVar24 << 0x15 | uVar24 >> 0xb) ^ uVar9;
    iVar14 = ((uVar32 ^ uVar31) & uVar12 ^ uVar32) + uVar21 + (uVar22 << 0x1a | uVar22 >> 6) +
             SHA256_K[uVar13 + 0x10] + uVar20;
    uVar19 = uVar19 + iVar14;
    uVar29 = (uVar15 & local_f4) + ((uVar15 ^ local_f4) & uVar9) + (uVar24 << 0x1e | uVar24 >> 2) +
             iVar14;
    uVar24 = (local_108 << 0x1e | local_108 >> 2) ^ local_108;
    uVar21 = (uVar10 << 0x15 | uVar10 >> 0xb) ^ uVar10;
    uVar22 = (uVar19 * 0x40000 | uVar19 >> 0xe) ^ uVar19;
    uVar27 = uVar27 + local_104 + (uVar10 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (local_108 >> 10 ^ (uVar24 << 0xf | uVar24 >> 0x11));
    uVar21 = (uVar22 << 0x1b | uVar22 >> 5) ^ uVar19;
    iVar14 = uVar32 + SHA256_K[uVar13 + 0x11] + uVar27 + ((uVar31 ^ uVar12) & uVar19 ^ uVar31) +
             (uVar21 << 0x1a | uVar21 >> 6);
    uVar21 = (uVar29 * 0x800000 | uVar29 >> 9) ^ uVar29;
    uVar21 = (uVar21 << 0x15 | uVar21 >> 0xb) ^ uVar29;
    uVar15 = uVar15 + iVar14;
    uVar24 = (uVar20 * 0x40000000 | uVar20 >> 2) ^ uVar20;
    uVar22 = (local_f4 & uVar9) + ((local_f4 ^ uVar9) & uVar29) + (uVar21 << 0x1e | uVar21 >> 2) +
             iVar14;
    uVar21 = (uVar18 << 0x15 | uVar18 >> 0xb) ^ uVar18;
    uVar28 = (uVar15 * 0x40000 | uVar15 >> 0xe) ^ uVar15;
    uVar28 = (uVar28 << 0x1b | uVar28 >> 5) ^ uVar15;
    uVar10 = uVar10 + local_cc + (uVar18 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
             (uVar20 >> 10 ^ (uVar24 << 0xf | uVar24 >> 0x11));
    iVar14 = uVar31 + SHA256_K[uVar13 + 0x12] + uVar10 + ((uVar19 ^ uVar12) & uVar15 ^ uVar12) +
             (uVar28 << 0x1a | uVar28 >> 6);
    uVar21 = (uVar22 * 0x800000 | uVar22 >> 9) ^ uVar22;
    uVar21 = (uVar21 << 0x15 | uVar21 >> 0xb) ^ uVar22;
    local_f4 = local_f4 + iVar14;
    uVar31 = (uVar29 & uVar9) + ((uVar29 ^ uVar9) & uVar22) + (uVar21 << 0x1e | uVar21 >> 2) +
             iVar14;
    uVar21 = (uVar27 * 0x40000000 | uVar27 >> 2) ^ uVar27;
    uVar24 = (local_d8 << 0x15 | local_d8 >> 0xb) ^ local_d8;
    uVar18 = uVar18 + local_c8 + (local_d8 >> 3 ^ (uVar24 << 0x19 | uVar24 >> 7)) +
             (uVar27 >> 10 ^ (uVar21 << 0xf | uVar21 >> 0x11));
    uVar21 = (local_f4 * 0x40000 | local_f4 >> 0xe) ^ local_f4;
    uVar21 = (uVar21 << 0x1b | uVar21 >> 5) ^ local_f4;
    iVar14 = uVar12 + SHA256_K[uVar13 + 0x13] + uVar18 + ((uVar15 ^ uVar19) & local_f4 ^ uVar19) +
             (uVar21 << 0x1a | uVar21 >> 6);
    uVar12 = (uVar31 * 0x800000 | uVar31 >> 9) ^ uVar31;
    uVar12 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar31;
    uVar9 = uVar9 + iVar14;
    uVar34 = (uVar22 & uVar29) + ((uVar22 ^ uVar29) & uVar31) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar14;
    uVar12 = (uVar10 * 0x40000000 | uVar10 >> 2) ^ uVar10;
    uVar21 = (local_dc << 0x15 | local_dc >> 0xb) ^ local_dc;
    local_d8 = local_d8 + local_e4 + (local_dc >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
               (uVar10 >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar12 = (uVar9 * 0x40000 | uVar9 >> 0xe) ^ uVar9;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar9;
    iVar14 = uVar19 + SHA256_K[uVar13 + 0x14] + local_d8 + ((local_f4 ^ uVar15) & uVar9 ^ uVar15) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar12 = (uVar34 * 0x800000 | uVar34 >> 9) ^ uVar34;
    uVar12 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar34;
    uVar29 = uVar29 + iVar14;
    uVar19 = (uVar31 & uVar22) + ((uVar31 ^ uVar22) & uVar34) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar14;
    uVar12 = (uVar18 * 0x40000000 | uVar18 >> 2) ^ uVar18;
    uVar21 = (local_e0 << 0x15 | local_e0 >> 0xb) ^ local_e0;
    local_dc = local_dc + uVar11 + (local_e0 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
               (uVar18 >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar12 = (uVar29 * 0x40000 | uVar29 >> 0xe) ^ uVar29;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar29;
    iVar14 = SHA256_K[uVar13 + 0x15] + local_dc + uVar15 + ((uVar9 ^ local_f4) & uVar29 ^ local_f4)
             + (uVar12 << 0x1a | uVar12 >> 6);
    uVar12 = (uVar19 * 0x800000 | uVar19 >> 9) ^ uVar19;
    uVar15 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar19;
    uVar12 = (local_d8 * 0x40000000 | local_d8 >> 2) ^ local_d8;
    uVar33 = (local_f8 << 0x15 | local_f8 >> 0xb) ^ local_f8;
    uVar22 = uVar22 + iVar14;
    uVar23 = (uVar34 & uVar31) + ((uVar34 ^ uVar31) & uVar19) + (uVar15 << 0x1e | uVar15 >> 2) +
             iVar14;
    uVar32 = (uVar17 << 0x15 | uVar17 >> 0xb) ^ uVar17;
    uVar35 = (local_104 << 0x15 | local_104 >> 0xb) ^ local_104;
    uVar24 = (uVar20 * 0x200000 | uVar20 >> 0xb) ^ uVar20;
    uVar16 = (local_cc << 0x15 | local_cc >> 0xb) ^ local_cc;
    uVar28 = (local_108 << 0x15 | local_108 >> 0xb) ^ local_108;
    uVar25 = (local_c8 << 0x15 | local_c8 >> 0xb) ^ local_c8;
    uVar15 = (uVar11 << 0x15 | uVar11 >> 0xb) ^ uVar11;
    uVar30 = (local_e4 << 0x15 | local_e4 >> 0xb) ^ local_e4;
    uVar21 = (local_c4 << 0x15 | local_c4 >> 0xb) ^ local_c4;
    local_e0 = local_e0 + local_108 + (local_c4 >> 3 ^ (uVar21 << 0x19 | uVar21 >> 7)) +
               (local_d8 >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar12 = (uVar22 * 0x40000 | uVar22 >> 0xe) ^ uVar22;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar22;
    iVar14 = SHA256_K[uVar13 + 0x16] + local_e0 + local_f4 + ((uVar29 ^ uVar9) & uVar22 ^ uVar9) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar12 = (uVar23 * 0x800000 | uVar23 >> 9) ^ uVar23;
    uVar12 = (uVar12 << 0x15 | uVar12 >> 0xb) ^ uVar23;
    uVar31 = uVar31 + iVar14;
    uVar26 = (uVar19 & uVar34) + ((uVar19 ^ uVar34) & uVar23) + (uVar12 << 0x1e | uVar12 >> 2) +
             iVar14;
    uVar12 = (local_dc * 0x40000000 | local_dc >> 2) ^ local_dc;
    local_c4 = (local_f8 >> 3 ^ (uVar33 << 0x19 | uVar33 >> 7)) + local_c4 + uVar20 +
               (local_dc >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar12 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar31;
    uVar12 = (uVar12 << 0x1b | uVar12 >> 5) ^ uVar31;
    iVar14 = SHA256_K[uVar13 + 0x17] + local_c4 + uVar9 + ((uVar22 ^ uVar29) & uVar31 ^ uVar29) +
             (uVar12 << 0x1a | uVar12 >> 6);
    uVar9 = (uVar26 * 0x800000 | uVar26 >> 9) ^ uVar26;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar26;
    uVar34 = uVar34 + iVar14;
    uVar33 = (uVar23 & uVar19) + ((uVar23 ^ uVar19) & uVar26) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar9 = (local_e0 * 0x40000000 | local_e0 >> 2) ^ local_e0;
    local_f8 = (uVar17 >> 3 ^ (uVar32 << 0x19 | uVar32 >> 7)) + local_f8 + uVar27 +
               (local_e0 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar34 * 0x40000 | uVar34 >> 0xe) ^ uVar34;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar34;
    iVar14 = SHA256_K[uVar13 + 0x18] + local_f8 + uVar29 + ((uVar31 ^ uVar22) & uVar34 ^ uVar22) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar33 * 0x800000 | uVar33 >> 9) ^ uVar33;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar33;
    uVar19 = uVar19 + iVar14;
    uVar21 = (uVar26 & uVar23) + ((uVar26 ^ uVar23) & uVar33) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar9 = (local_c4 * 0x40000000 | local_c4 >> 2) ^ local_c4;
    uVar17 = (local_104 >> 3 ^ (uVar35 << 0x19 | uVar35 >> 7)) + uVar17 + uVar10 +
             (local_c4 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar19 * 0x40000 | uVar19 >> 0xe) ^ uVar19;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar19;
    iVar14 = SHA256_K[uVar13 + 0x19] + uVar17 + uVar22 + ((uVar34 ^ uVar31) & uVar19 ^ uVar31) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar21 * 0x800000 | uVar21 >> 9) ^ uVar21;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar21;
    uVar23 = uVar23 + iVar14;
    uVar12 = (local_f8 * 0x40000000 | local_f8 >> 2) ^ local_f8;
    uVar32 = (uVar33 & uVar26) + ((uVar33 ^ uVar26) & uVar21) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    local_104 = (local_cc >> 3 ^ (uVar16 << 0x19 | uVar16 >> 7)) + local_104 + uVar18 +
                (local_f8 >> 10 ^ (uVar12 << 0xf | uVar12 >> 0x11));
    uVar9 = (uVar23 * 0x40000 | uVar23 >> 0xe) ^ uVar23;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar23;
    iVar14 = SHA256_K[uVar13 + 0x1a] + local_104 + uVar31 + ((uVar19 ^ uVar34) & uVar23 ^ uVar34) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar32 * 0x800000 | uVar32 >> 9) ^ uVar32;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar32;
    uVar26 = uVar26 + iVar14;
    uVar31 = (uVar21 & uVar33) + ((uVar21 ^ uVar33) & uVar32) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar9 = (uVar17 * 0x40000000 | uVar17 >> 2) ^ uVar17;
    local_cc = (local_c8 >> 3 ^ (uVar25 << 0x19 | uVar25 >> 7)) + local_cc + local_d8 +
               (uVar17 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar26 * 0x40000 | uVar26 >> 0xe) ^ uVar26;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar26;
    iVar14 = SHA256_K[uVar13 + 0x1b] + local_cc + uVar34 + ((uVar23 ^ uVar19) & uVar26 ^ uVar19) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar31 * 0x800000 | uVar31 >> 9) ^ uVar31;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar31;
    uVar33 = uVar33 + iVar14;
    uVar12 = (uVar32 & uVar21) + ((uVar32 ^ uVar21) & uVar31) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar9 = (local_104 * 0x40000000 | local_104 >> 2) ^ local_104;
    local_c8 = (local_e4 >> 3 ^ (uVar30 << 0x19 | uVar30 >> 7)) + local_c8 + local_dc +
               (local_104 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar33 * 0x40000 | uVar33 >> 0xe) ^ uVar33;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar33;
    iVar14 = SHA256_K[uVar13 + 0x1c] + local_c8 + uVar19 + ((uVar26 ^ uVar23) & uVar33 ^ uVar23) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar12 * 0x800000 | uVar12 >> 9) ^ uVar12;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar12;
    uVar21 = uVar21 + iVar14;
    uVar19 = (uVar31 & uVar32) + ((uVar31 ^ uVar32) & uVar12) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar9 = (local_cc * 0x40000000 | local_cc >> 2) ^ local_cc;
    local_e4 = (uVar11 >> 3 ^ (uVar15 << 0x19 | uVar15 >> 7)) + local_e4 + local_e0 +
               (local_cc >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar21;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar21;
    iVar14 = SHA256_K[uVar13 + 0x1d] + local_e4 + uVar23 + ((uVar33 ^ uVar26) & uVar21 ^ uVar26) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar19 * 0x800000 | uVar19 >> 9) ^ uVar19;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar19;
    uVar32 = uVar32 + iVar14;
    uVar22 = (local_c8 * 0x40000000 | local_c8 >> 2) ^ local_c8;
    uVar15 = (uVar12 & uVar31) + ((uVar12 ^ uVar31) & uVar19) + (uVar9 << 0x1e | uVar9 >> 2) +
             iVar14;
    uVar11 = (local_108 >> 3 ^ (uVar28 << 0x19 | uVar28 >> 7)) + uVar11 + local_c4 +
             (local_c8 >> 10 ^ (uVar22 << 0xf | uVar22 >> 0x11));
    uVar9 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar32;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar32;
    iVar14 = SHA256_K[uVar13 + 0x1e] + uVar11 + uVar26 + ((uVar21 ^ uVar33) & uVar32 ^ uVar33) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (uVar15 * 0x800000 | uVar15 >> 9) ^ uVar15;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ uVar15;
    uVar31 = uVar31 + iVar14;
    local_f4 = (uVar19 & uVar12) + ((uVar19 ^ uVar12) & uVar15) + (uVar9 << 0x1e | uVar9 >> 2) +
               iVar14;
    uVar9 = (local_e4 * 0x40000000 | local_e4 >> 2) ^ local_e4;
    local_108 = (uVar20 >> 3 ^ (uVar24 << 0x19 | uVar24 >> 7)) + local_108 + local_f8 +
                (local_e4 >> 10 ^ (uVar9 << 0xf | uVar9 >> 0x11));
    uVar9 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar31;
    uVar9 = (uVar9 << 0x1b | uVar9 >> 5) ^ uVar31;
    iVar14 = SHA256_K[uVar13 + 0x1f] + local_108 + uVar33 + ((uVar32 ^ uVar21) & uVar31 ^ uVar21) +
             (uVar9 << 0x1a | uVar9 >> 6);
    uVar9 = (local_f4 * 0x800000 | local_f4 >> 9) ^ local_f4;
    uVar9 = (uVar9 << 0x15 | uVar9 >> 0xb) ^ local_f4;
    uVar12 = uVar12 + iVar14;
    uVar9 = (uVar15 & uVar19) + ((uVar15 ^ uVar19) & local_f4) + (uVar9 << 0x1e | uVar9 >> 2) +
            iVar14;
    uVar13 = uVar13 + 0x10;
  } while (uVar13 < 0x30);
  (check->state).crc32 = uVar9 + uVar1;
  (check->state).sha256.state[1] = local_f4 + uVar2;
  (check->state).sha256.state[2] = uVar15 + uVar3;
  (check->state).sha256.state[3] = uVar19 + uVar4;
  (check->state).sha256.state[4] = uVar12 + uVar5;
  (check->state).sha256.state[5] = uVar31 + uVar6;
  (check->state).sha256.state[6] = uVar32 + uVar7;
  (check->state).sha256.state[7] = uVar21 + uVar8;
  return;
}

Assistant:

static void
transform(uint32_t state[8], const uint32_t data[16])
{
	uint32_t W[16];
	uint32_t T[8];

	// Copy state[] to working vars.
	memcpy(T, state, sizeof(T));

	// The first 16 operations unrolled
	R0( 0); R0( 1); R0( 2); R0( 3);
	R0( 4); R0( 5); R0( 6); R0( 7);
	R0( 8); R0( 9); R0(10); R0(11);
	R0(12); R0(13); R0(14); R0(15);

	// The remaining 48 operations partially unrolled
	for (unsigned int j = 16; j < 64; j += 16) {
		R2( 0); R2( 1); R2( 2); R2( 3);
		R2( 4); R2( 5); R2( 6); R2( 7);
		R2( 8); R2( 9); R2(10); R2(11);
		R2(12); R2(13); R2(14); R2(15);
	}

	// Add the working vars back into state[].
	state[0] += a(0);
	state[1] += b(0);
	state[2] += c(0);
	state[3] += d(0);
	state[4] += e(0);
	state[5] += f(0);
	state[6] += g(0);
	state[7] += h(0);
}